

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_db502b::DummySignatureCreator::CreateSig
          (DummySignatureCreator *this,SigningProvider *provider,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig,CKeyID *keyid,
          CScript *scriptCode,SigVersion sigversion)

{
  long lVar1;
  value_type vVar2;
  reference pvVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  value_type_conflict *in_stack_ffffffffffffffa8;
  undefined5 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  value_type vVar4;
  undefined1 in_stack_ffffffffffffffb7;
  value_type vVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::assign
            (in_RDI,CONCAT17(in_stack_ffffffffffffffb7,
                             CONCAT16(in_stack_ffffffffffffffb6,
                                      CONCAT15(in_stack_ffffffffffffffb5,in_stack_ffffffffffffffb0))
                            ),in_stack_ffffffffffffffa8);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (in_RDI,CONCAT17(in_stack_ffffffffffffffb7,
                                      CONCAT16(in_stack_ffffffffffffffb6,
                                               CONCAT15(in_stack_ffffffffffffffb5,
                                                        in_stack_ffffffffffffffb0))));
  *pvVar3 = '0';
  vVar2 = (char)*(undefined4 *)
                 &(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish +
          *(char *)((long)&(in_RDI->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish + 1) + '\x04';
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (in_RDI,CONCAT17(in_stack_ffffffffffffffb7,
                                      CONCAT16(in_stack_ffffffffffffffb6,
                                               CONCAT15(vVar2,in_stack_ffffffffffffffb0))));
  *pvVar3 = vVar2;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (in_RDI,CONCAT17(in_stack_ffffffffffffffb7,
                                      CONCAT16(in_stack_ffffffffffffffb6,
                                               CONCAT15(vVar2,in_stack_ffffffffffffffb0))));
  *pvVar3 = '\x02';
  vVar4 = *(value_type *)
           &(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (in_RDI,CONCAT17(in_stack_ffffffffffffffb7,
                                      CONCAT16(vVar4,CONCAT15(vVar2,in_stack_ffffffffffffffb0))));
  *pvVar3 = vVar4;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (in_RDI,CONCAT17(in_stack_ffffffffffffffb7,
                                      CONCAT16(vVar4,CONCAT15(vVar2,in_stack_ffffffffffffffb0))));
  *pvVar3 = '\x01';
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (in_RDI,CONCAT17(in_stack_ffffffffffffffb7,
                                      CONCAT16(vVar4,CONCAT15(vVar2,in_stack_ffffffffffffffb0))));
  *pvVar3 = '\x02';
  vVar5 = *(value_type *)
           ((long)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish + 1);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (in_RDI,CONCAT17(vVar5,CONCAT16(vVar4,CONCAT15(vVar2,in_stack_ffffffffffffffb0)
                                                    )));
  *pvVar3 = vVar5;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (in_RDI,CONCAT17(vVar5,CONCAT16(vVar4,CONCAT15(vVar2,in_stack_ffffffffffffffb0)
                                                    )));
  *pvVar3 = '\x01';
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (in_RDI,CONCAT17(vVar5,CONCAT16(vVar4,CONCAT15(vVar2,in_stack_ffffffffffffffb0)
                                                    )));
  *pvVar3 = '\x01';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool CreateSig(const SigningProvider& provider, std::vector<unsigned char>& vchSig, const CKeyID& keyid, const CScript& scriptCode, SigVersion sigversion) const override
    {
        // Create a dummy signature that is a valid DER-encoding
        vchSig.assign(m_r_len + m_s_len + 7, '\000');
        vchSig[0] = 0x30;
        vchSig[1] = m_r_len + m_s_len + 4;
        vchSig[2] = 0x02;
        vchSig[3] = m_r_len;
        vchSig[4] = 0x01;
        vchSig[4 + m_r_len] = 0x02;
        vchSig[5 + m_r_len] = m_s_len;
        vchSig[6 + m_r_len] = 0x01;
        vchSig[6 + m_r_len + m_s_len] = SIGHASH_ALL;
        return true;
    }